

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

void Abc_NtkBalancePerform
               (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkAig,int fDuplicate,int fSelective,int fUpdateLevel)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  Vec_Vec_t *vStorage;
  void **ppvVar5;
  void *pvVar6;
  ProgressBar *p;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int nItemsCur;
  
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)pVVar7->pArray[lVar4] + 0x40);
      *(uint *)(lVar1 + 0x14) =
           *(uint *)(lVar1 + 0x14) & 0xfff |
           *(uint *)((long)pVVar7->pArray[lVar4] + 0x14) & 0xfffff000;
      lVar4 = lVar4 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar4 < pVVar7->nSize);
  }
  Abc_NtkSetNodeLevelsArrival(pNtk);
  vStorage = (Vec_Vec_t *)malloc(0x10);
  vStorage->nCap = 10;
  ppvVar5 = (void **)malloc(0x50);
  vStorage->pArray = ppvVar5;
  lVar4 = 0;
  do {
    pvVar6 = calloc(1,0x10);
    ppvVar5[lVar4] = pvVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  vStorage->nSize = 10;
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  pVVar7 = pNtk->vCos;
  iVar8 = pVVar7->nSize;
  if (pNtk->nBarBufs == 0) {
    if (0 < iVar8) {
      lVar4 = 0;
      do {
        plVar2 = (long *)pVVar7->pArray[lVar4];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar4)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar4,(char *)0x0);
        }
        Abc_NodeBalance_rec(pNtkAig,*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)plVar2[4] * 8),vStorage,0,fDuplicate,fSelective,
                            fUpdateLevel);
        lVar4 = lVar4 + 1;
        pVVar7 = pNtk->vCos;
      } while (lVar4 < pVVar7->nSize);
    }
  }
  else if (0 < iVar8) {
    nItemsCur = 0;
    do {
      iVar9 = 0;
      if (nItemsCur < pNtk->nBarBufs) {
        iVar9 = iVar8;
      }
      uVar10 = (iVar9 - pNtk->nBarBufs) + nItemsCur;
      if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)pVVar7->pArray[uVar10];
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= nItemsCur)) {
        Extra_ProgressBarUpdate_int(p,nItemsCur,(char *)0x0);
      }
      Abc_NodeBalance_rec(pNtkAig,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8),vStorage,0,fDuplicate,fSelective,
                          fUpdateLevel);
      if (nItemsCur < pNtk->nBarBufs) {
        lVar4 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        plVar3 = *(long **)(lVar4 + (long)*(int *)plVar2[6] * 8);
        lVar1 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        *(uint *)(lVar1 + 0x14) =
             *(uint *)(lVar1 + 0x14) & 0xfff |
             *(uint *)(*(long *)(lVar4 + (long)*(int *)plVar2[4] * 8) + 0x14) & 0xfffff000;
      }
      nItemsCur = nItemsCur + 1;
      pVVar7 = pNtk->vCos;
      iVar8 = pVVar7->nSize;
    } while (nItemsCur < iVar8);
  }
  Extra_ProgressBarStop(p);
  iVar8 = vStorage->nSize;
  ppvVar5 = vStorage->pArray;
  if ((long)iVar8 < 1) {
    if (ppvVar5 == (void **)0x0) goto LAB_00298634;
  }
  else {
    lVar4 = 0;
    do {
      pvVar6 = ppvVar5[lVar4];
      if (pvVar6 != (void *)0x0) {
        if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar6 + 8));
        }
        free(pvVar6);
      }
      lVar4 = lVar4 + 1;
    } while (iVar8 != lVar4);
  }
  free(ppvVar5);
LAB_00298634:
  free(vStorage);
  return;
}

Assistant:

void Abc_NtkBalancePerform( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkAig, int fDuplicate, int fSelective, int fUpdateLevel )
{
    ProgressBar * pProgress;
    Vec_Vec_t * vStorage;
    Abc_Obj_t * pNode;
    int i;
    // transfer level
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy->Level = pNode->Level;
    // set the level of PIs of AIG according to the arrival times of the old network
    Abc_NtkSetNodeLevelsArrival( pNtk );
    // allocate temporary storage for supergates
    vStorage = Vec_VecStart( 10 );
    // perform balancing of POs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            Extra_ProgressBarUpdate( pProgress, i, NULL );
            Abc_NodeBalance_rec( pNtkAig, Abc_ObjFanin0(pNode), vStorage, 0, fDuplicate, fSelective, fUpdateLevel );
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Extra_ProgressBarUpdate( pProgress, i, NULL );
            Abc_NodeBalance_rec( pNtkAig, Abc_ObjFanin0(pNode), vStorage, 0, fDuplicate, fSelective, fUpdateLevel );
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = Abc_ObjFanin0(pNode)->Level;
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_VecFree( vStorage );
}